

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

bool __thiscall slang::ast::Expression::isImplicitString(Expression *this)

{
  bool bVar1;
  UnaryExpression *this_00;
  BinaryExpression *this_01;
  ReplicationExpression *this_02;
  ValueRangeExpression *this_03;
  MinTypMaxExpression *this_04;
  NamedValueExpression *pNVar2;
  ConversionExpression *this_05;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  *__lhs;
  Expression *in_RDI;
  ConversionExpression *conv;
  NamedValueExpression *nv;
  MinTypMaxExpression *mtm;
  ValueRangeExpression *range;
  ReplicationExpression *repl;
  Expression *op_2;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ConcatenationExpression *concat;
  ConditionalExpression *op_1;
  BinaryExpression *op;
  undefined2 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5a;
  undefined1 in_stack_ffffffffffffff5b;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  ParameterSymbol *in_stack_ffffffffffffff70;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_48;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_40;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_30;
  ConcatenationExpression *local_28;
  ConditionalExpression *local_20;
  Expression *in_stack_ffffffffffffffe8;
  bool local_1;
  
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x8a5455);
  bVar1 = Type::isString((Type *)0x8a545d);
  if (bVar1) {
    local_1 = true;
  }
  else {
    __lhs = (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
             *)(ulong)(in_RDI->kind - StringLiteral);
    switch(__lhs) {
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x0:
      local_1 = true;
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x1:
      pNVar2 = as<slang::ast::NamedValueExpression>(in_RDI);
      local_1 = false;
      if ((((pNVar2->super_ValueExpressionBase).symbol)->super_Symbol).kind == Parameter) {
        Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x8a5742);
        local_1 = ParameterSymbol::isImplicitString(in_stack_ffffffffffffff70,in_RDI->sourceRange);
      }
      break;
    default:
      local_1 = false;
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x3:
      this_00 = as<slang::ast::UnaryExpression>(in_RDI);
      UnaryExpression::operand(this_00);
      local_1 = isImplicitString(in_stack_ffffffffffffffe8);
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x4:
      this_01 = as<slang::ast::BinaryExpression>(in_RDI);
      BinaryExpression::left(this_01);
      bVar1 = isImplicitString(&this_01->super_Expression);
      local_1 = true;
      if (!bVar1) {
        BinaryExpression::right(this_01);
        local_1 = isImplicitString(&this_01->super_Expression);
      }
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x5:
      local_20 = as<slang::ast::ConditionalExpression>(in_RDI);
      ConditionalExpression::left(local_20);
      bVar1 = isImplicitString(in_stack_ffffffffffffffe8);
      local_1 = true;
      if (!bVar1) {
        ConditionalExpression::right(local_20);
        local_1 = isImplicitString(in_stack_ffffffffffffffe8);
      }
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x8:
      local_28 = as<slang::ast::ConcatenationExpression>(in_RDI);
      local_40 = ConcatenationExpression::operands(local_28);
      local_30 = &local_40;
      local_48._M_current =
           (Expression **)
           std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                      CONCAT17(in_stack_ffffffffffffff5f,
                               CONCAT16(in_stack_ffffffffffffff5e,
                                        CONCAT15(in_stack_ffffffffffffff5d,
                                                 CONCAT14(in_stack_ffffffffffffff5c,
                                                          CONCAT13(in_stack_ffffffffffffff5b,
                                                                   CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  in_stack_ffffffffffffff58)))))));
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               (__lhs,(__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                       *)CONCAT17(in_stack_ffffffffffffff5f,
                                                  CONCAT16(in_stack_ffffffffffffff5e,
                                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    in_stack_ffffffffffffff58)))))))
            , ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator*(&local_48);
        bVar1 = isImplicitString(in_stack_ffffffffffffffe8);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator++(&local_48);
      }
      local_1 = false;
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x9:
      this_02 = as<slang::ast::ReplicationExpression>(in_RDI);
      ReplicationExpression::concat(this_02);
      local_1 = isImplicitString(in_stack_ffffffffffffffe8);
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0xf:
      this_05 = as<slang::ast::ConversionExpression>(in_RDI);
      bVar1 = ConversionExpression::isImplicit(this_05);
      local_1 = false;
      if (bVar1) {
        ConversionExpression::operand(this_05);
        local_1 = isImplicitString(in_stack_ffffffffffffffe8);
      }
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x18:
      this_03 = as<slang::ast::ValueRangeExpression>(in_RDI);
      ValueRangeExpression::left(this_03);
      bVar1 = isImplicitString(in_stack_ffffffffffffffe8);
      local_1 = true;
      if ((!bVar1) && (local_1 = false, this_03->rangeKind == Simple)) {
        ValueRangeExpression::right(this_03);
        local_1 = isImplicitString(in_stack_ffffffffffffffe8);
      }
      break;
    case (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          *)0x1e:
      this_04 = as<slang::ast::MinTypMaxExpression>(in_RDI);
      MinTypMaxExpression::selected(this_04);
      local_1 = isImplicitString(in_stack_ffffffffffffffe8);
    }
  }
  return local_1;
}

Assistant:

bool Expression::isImplicitString() const {
    if (type->isString())
        return true;

    switch (kind) {
        case ExpressionKind::StringLiteral:
            return true;
        case ExpressionKind::UnaryOp:
            return as<UnaryExpression>().operand().isImplicitString();
        case ExpressionKind::BinaryOp: {
            auto& op = as<BinaryExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::ConditionalOp: {
            auto& op = as<ConditionalExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            for (auto op : concat.operands()) {
                if (op->isImplicitString())
                    return true;
            }
            return false;
        }
        case ExpressionKind::Replication: {
            auto& repl = as<ReplicationExpression>();
            return repl.concat().isImplicitString();
        }
        case ExpressionKind::ValueRange: {
            auto& range = as<ValueRangeExpression>();
            return range.left().isImplicitString() ||
                   (range.rangeKind == ValueRangeKind::Simple && range.right().isImplicitString());
        }
        case ExpressionKind::MinTypMax: {
            auto& mtm = as<MinTypMaxExpression>();
            return mtm.selected().isImplicitString();
        }
        case ExpressionKind::NamedValue: {
            auto& nv = as<NamedValueExpression>();
            return nv.symbol.kind == SymbolKind::Parameter &&
                   nv.symbol.as<ParameterSymbol>().isImplicitString(sourceRange);
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            return conv.isImplicit() && conv.operand().isImplicitString();
        }
        default:
            return false;
    }
}